

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinStencilFunc::emulate_mthd(MthdKelvinStencilFunc *this)

{
  _Bool _Var1;
  int iVar2;
  uint local_18;
  uint local_14;
  uint32_t err;
  uint32_t rval;
  MthdKelvinStencilFunc *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = 0;
  local_18 = 0;
  if (((this->super_SingleMthdTest).super_MthdTest.val < 0x200) ||
     (0x207 < (this->super_SingleMthdTest).super_MthdTest.val)) {
    if ((((this->super_SingleMthdTest).super_MthdTest.val == 0) ||
        (8 < (this->super_SingleMthdTest).super_MthdTest.val)) ||
       (iVar2 = pgraph_3d_class(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp),
       iVar2 != 6)) {
      local_18 = 1;
    }
    else {
      local_14 = (this->super_SingleMthdTest).super_MthdTest.val - 1;
    }
  }
  else {
    local_14 = (this->super_SingleMthdTest).super_MthdTest.val & 7;
  }
  _Var1 = pgraph_in_begin_end(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (_Var1) {
    local_18 = local_18 | 4;
  }
  if (local_18 == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
      if (this->side == 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a &
             0xffffff0f | (local_14 & 0xf) << 4;
        pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0xd,0,
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_stencil_a,true);
      }
      else {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_d =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_d &
             0xfff0ffff | (local_14 & 0xf) << 0x10;
        pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x10,0,
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_stencil_d,true);
      }
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_18);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t rval = 0;
		uint32_t err = 0;
		if (val >= 0x200 && val < 0x208) {
			rval = val & 7;
		} else if (val > 0 && val <= 8 && pgraph_3d_class(&exp) == PGRAPH_3D_CURIE) {
			rval = val - 1;
		} else {
			err |= 1;
		}
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				if (side == 0) {
					insrt(exp.bundle_stencil_a, 4, 4, rval);
					pgraph_bundle(&exp, BUNDLE_STENCIL_A, 0, exp.bundle_stencil_a, true);
				} else {
					insrt(exp.bundle_stencil_d, 16, 4, rval);
					pgraph_bundle(&exp, BUNDLE_STENCIL_D, 0, exp.bundle_stencil_d, true);
				}
			}
		}
	}